

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ErrorCheckClasses.cpp
# Opt level: O1

void __thiscall
GdlSetAttrItem::FixGlyphAttrsInRules
          (GdlSetAttrItem *this,GrcManager *pcman,
          vector<GdlGlyphClassDefn_*,_std::allocator<GdlGlyphClassDefn_*>_> *vpglfcInClasses,
          GdlRule *prule,int irit)

{
  pointer *pppGVar1;
  GdlAttrValueSpec *pGVar2;
  GrcSymbolTableEntry *pGVar3;
  pointer pcVar4;
  size_t sVar5;
  pointer ppGVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  undefined4 extraout_var;
  pointer ppGVar10;
  undefined4 extraout_var_00;
  undefined8 extraout_RAX;
  long *extraout_RAX_00;
  long *plVar11;
  undefined4 extraout_var_01;
  string *psVar12;
  ulong uVar13;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  GdlObject *pGVar15;
  char cVar16;
  long lVar17;
  byte bVar18;
  _Alloc_hider _Var19;
  undefined8 uVar20;
  long *plVar21;
  undefined4 in_register_00000084;
  Symbol pGVar22;
  byte bVar23;
  GdlSetAttrItem *pGVar24;
  byte bVar25;
  uint uVar26;
  long lVar27;
  ulong uVar28;
  long lVar29;
  bool fGpointWith;
  bool fXYWith;
  bool fGpointAt;
  bool fXYAt;
  string staT;
  int nTmp;
  char local_25c;
  undefined1 local_25b [3];
  GdlSetAttrItem *local_258;
  uint local_24c;
  undefined8 local_248;
  GrcManager *local_240;
  vector<GdlGlyphClassDefn_*,_std::allocator<GdlGlyphClassDefn_*>_> *local_238;
  GdlObject *local_230;
  long *local_228 [2];
  long local_218 [2];
  ulong local_208;
  undefined8 local_200;
  string *local_1f8;
  ulong local_1f0;
  ulong local_1e8;
  long *local_1e0;
  size_t local_1d8;
  long local_1d0 [2];
  long *local_1c0;
  size_t local_1b8;
  long local_1b0 [2];
  string local_1a0;
  string local_180;
  long local_160;
  long *local_158;
  size_t local_150;
  long local_148 [2];
  long *local_138;
  size_t local_130;
  long local_128 [2];
  string local_118;
  string local_f8;
  string local_d8;
  undefined1 local_b4 [4];
  long *local_b0;
  size_t local_a8;
  long local_a0 [2];
  long *local_90;
  size_t local_88;
  long local_80 [2];
  string local_70;
  string local_50;
  undefined7 uVar30;
  
  pGVar22 = (Symbol)CONCAT44(in_register_00000084,irit);
  local_24c = irit;
  local_240 = pcman;
  local_238 = vpglfcInClasses;
  GdlRuleItem::FixGlyphAttrsInRules(&this->super_GdlRuleItem,pcman,vpglfcInClasses,prule,irit);
  bVar25 = 0;
  local_25b[2] = '\0';
  local_25b[1] = '\0';
  local_25b[0] = '\0';
  local_25c = '\0';
  iVar9 = (*(this->super_GdlRuleItem)._vptr_GdlRuleItem[0x26])(this);
  local_160 = CONCAT44(extraout_var,iVar9);
  ppGVar10 = (this->m_vpavs).
             super__Vector_base<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  bVar18 = 0;
  pGVar24 = (GdlSetAttrItem *)0x0;
  psVar12 = (string *)0x0;
  uVar20 = 0;
  if (0 < (int)((ulong)((long)(this->m_vpavs).
                              super__Vector_base<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)ppGVar10) >> 3)) {
    pGVar15 = &(this->super_GdlRuleItem).super_GdlObject;
    lVar17 = 0;
    local_248 = 0;
    local_1f8 = (string *)0x0;
    pGVar24 = (GdlSetAttrItem *)0x0;
    local_200 = 0;
    local_208 = 0;
    local_1e8 = 0;
    local_1f0 = 0;
    local_230 = pGVar15;
    do {
      pGVar2 = ppGVar10[lVar17];
      pGVar3 = pGVar2->m_psymName;
      bVar8 = GrcSymbolTableEntry::IsAttachAtField(pGVar3);
      if (bVar8) {
        local_228[0] = local_218;
        pcVar4 = (pGVar3->m_staFieldName)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_228,pcVar4,pcVar4 + (pGVar3->m_staFieldName)._M_string_length);
        local_258 = (GdlSetAttrItem *)CONCAT71(local_258._1_7_,1);
        psVar12 = (string *)CONCAT71((int7)((ulong)pGVar15 >> 8),1);
        if (((ulong)local_1f8 & 1) == 0) {
          iVar9 = std::__cxx11::string::compare((char *)local_228);
          psVar12 = (string *)CONCAT71((int7)((ulong)psVar12 >> 8),1);
          if (iVar9 != 0) {
            iVar9 = std::__cxx11::string::compare((char *)local_228);
            psVar12 = (string *)CONCAT71((int7)((ulong)psVar12 >> 8),1);
            if (iVar9 != 0) {
              iVar9 = std::__cxx11::string::compare((char *)local_228);
              psVar12 = (string *)CONCAT71((int7)((ulong)psVar12 >> 8),iVar9 == 0);
            }
          }
        }
        local_1f8 = psVar12;
        if (((((ulong)pGVar24 & 1) == 0) &&
            (iVar9 = std::__cxx11::string::compare((char *)local_228), iVar9 != 0)) &&
           (iVar9 = std::__cxx11::string::compare((char *)local_228), iVar9 != 0)) {
          iVar9 = std::__cxx11::string::compare((char *)local_228);
          local_258 = (GdlSetAttrItem *)CONCAT71(local_258._1_7_,iVar9 == 0);
        }
        iVar9 = std::__cxx11::string::compare((char *)local_228);
        if (iVar9 == 0) {
          local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_d8,"Cannot use gpath function within a rule","");
          GrcErrorList::AddError(&g_errorList,0x101f,local_230,&local_d8);
          paVar14 = &local_d8.field_2;
          _Var19._M_p = local_d8._M_dataplus._M_p;
          goto LAB_0012feb8;
        }
        iVar9 = std::__cxx11::string::compare((char *)local_228);
        if (iVar9 == 0) {
          iVar9 = (*pGVar2->m_pexpValue->_vptr_GdlExpression[7])(pGVar2->m_pexpValue,local_b4,0);
          if ((char)iVar9 == '\0') goto LAB_0012fdd6;
          local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
          psVar12 = &local_180;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)psVar12,"Cannot use gpoint function within a rule","");
          GrcErrorList::AddError(&g_errorList,0x1020,local_230,psVar12);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_180._M_dataplus._M_p != &local_180.field_2) {
            operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
          }
          if ((char)iVar9 == '\0') goto LAB_0012fdd6;
        }
        else {
LAB_0012fdd6:
          if (((local_1e8 & 1) == 0) || (pGVar2->m_fFlattened == false)) {
            iVar9 = AttachToSettingValue(this);
            if (iVar9 == -2) {
              local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_118,"Inappropriate value of attach.to","");
              GrcErrorList::AddError(&g_errorList,0x1021,local_230,&local_118);
              local_248 = CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
              paVar14 = &local_118.field_2;
              _Var19._M_p = local_118._M_dataplus._M_p;
            }
            else {
              if (iVar9 != -1) {
                uVar30 = (undefined7)((ulong)psVar12 >> 8);
                if (pGVar2->m_fFlattened == true) {
                  local_1e8 = CONCAT71(uVar30,1);
                  pGVar22 = (Symbol)(local_25b + 2);
                  iVar9 = (*pGVar2->m_pexpValue->_vptr_GdlExpression[0x13])
                                    (pGVar2->m_pexpValue,local_240,local_238,(ulong)(iVar9 - 1U),
                                     pGVar22,local_25b + 1);
                  local_248 = CONCAT71((int7)(CONCAT44(extraout_var_01,iVar9) >> 8),1);
                }
                else {
                  local_248 = CONCAT71(uVar30,1);
                  GdlAttrValueSpec::FixGlyphAttrsInRules
                            (pGVar2,local_240,local_238,iVar9 - 1U,pGVar22);
                }
                goto LAB_0012fecb;
              }
              local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_f8,
                         "Attachment checks could not be done for value of attach.at","");
              GrcErrorList::AddWarning(&g_errorList,0x11a2,local_230,&local_f8);
              paVar14 = &local_f8.field_2;
              _Var19._M_p = local_f8._M_dataplus._M_p;
            }
LAB_0012feb8:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_Var19._M_p != paVar14) {
              operator_delete(_Var19._M_p,paVar14->_M_allocated_capacity + 1);
            }
          }
        }
LAB_0012fecb:
        plVar11 = local_218;
        if (local_228[0] != plVar11) {
          operator_delete(local_228[0],local_218[0] + 1);
          plVar11 = extraout_RAX_00;
        }
        pGVar24 = (GdlSetAttrItem *)
                  (CONCAT71((int7)((ulong)plVar11 >> 8),local_258._0_1_) & 0xffffffff);
      }
      else {
        bVar8 = GrcSymbolTableEntry::IsAttachWithField(pGVar3);
        if (bVar8) {
          local_228[0] = local_218;
          pcVar4 = (pGVar3->m_staFieldName)._M_dataplus._M_p;
          local_258 = pGVar24;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_228,pcVar4,pcVar4 + (pGVar3->m_staFieldName)._M_string_length);
          uVar30 = (undefined7)((ulong)pGVar3 >> 8);
          uVar28 = CONCAT71(uVar30,1);
          uVar13 = CONCAT71((int7)((ulong)pGVar15 >> 8),1);
          if ((local_200 & 1) == 0) {
            iVar9 = std::__cxx11::string::compare((char *)local_228);
            uVar13 = CONCAT71((int7)(uVar13 >> 8),1);
            if (iVar9 != 0) {
              iVar9 = std::__cxx11::string::compare((char *)local_228);
              uVar13 = CONCAT71((int7)(uVar13 >> 8),1);
              if (iVar9 != 0) {
                iVar9 = std::__cxx11::string::compare((char *)local_228);
                uVar13 = CONCAT71((int7)(uVar13 >> 8),iVar9 == 0);
              }
            }
          }
          local_200 = uVar13;
          if ((((local_208 & 1) == 0) &&
              (iVar9 = std::__cxx11::string::compare((char *)local_228), iVar9 != 0)) &&
             (iVar9 = std::__cxx11::string::compare((char *)local_228), iVar9 != 0)) {
            iVar9 = std::__cxx11::string::compare((char *)local_228);
            uVar28 = CONCAT71(uVar30,iVar9 == 0);
          }
          iVar9 = std::__cxx11::string::compare((char *)local_228);
          pGVar24 = local_258;
          if (iVar9 == 0) {
            local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_1a0,"Cannot use gpath function within a rule","");
            pGVar24 = local_258;
            GrcErrorList::AddError(&g_errorList,0x1022,local_230,&local_1a0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
              operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1
                             );
            }
          }
          else if (((local_1f0 & 1) == 0) || (pGVar2->m_fFlattened == false)) {
            if ((local_248 & 1) == 0) {
              iVar9 = AttachToSettingValue(this);
              local_248 = CONCAT71((int7)(CONCAT44(extraout_var_00,iVar9) >> 8),iVar9 != -1);
            }
            if (pGVar2->m_fFlattened == true) {
              local_1f0 = CONCAT71((int7)(uVar13 >> 8),1);
              pGVar22 = (Symbol)local_25b;
              (*pGVar2->m_pexpValue->_vptr_GdlExpression[0x13])
                        (pGVar2->m_pexpValue,local_240,local_238,(ulong)local_24c,pGVar22,&local_25c
                        );
            }
            else {
              GdlAttrValueSpec::FixGlyphAttrsInRules(pGVar2,local_240,local_238,local_24c,pGVar22);
            }
          }
          if (local_228[0] != local_218) {
            operator_delete(local_228[0],local_218[0] + 1);
          }
          local_208 = uVar28 & 0xffffffff;
        }
        else {
          bVar8 = GrcSymbolTableEntry::IsComponentRef(pGVar3);
          if (bVar8) {
            CheckCompBox(this,local_240,pGVar3);
          }
          else if (local_160 != 0) {
            GrcSymbolTableEntry::IsAttachTo(pGVar3);
            GdlAttrValueSpec::FixGlyphAttrsInRules(pGVar2,local_240,local_238,local_24c,pGVar22);
          }
        }
      }
      lVar17 = lVar17 + 1;
      ppGVar10 = (this->m_vpavs).
                 super__Vector_base<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_>._M_impl
                 .super__Vector_impl_data._M_start;
      pGVar15 = (GdlObject *)
                (long)(int)((ulong)((long)(this->m_vpavs).
                                          super__Vector_base<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)ppGVar10) >> 3);
    } while (lVar17 < (long)pGVar15);
    bVar18 = (byte)local_200;
    bVar25 = (byte)local_208;
    psVar12 = local_1f8;
    uVar20 = local_248;
  }
  bVar23 = (byte)pGVar24;
  if ((uVar20 & 1) == 0) {
    if (((bVar18 | bVar25 | (byte)psVar12 | bVar23) & 1) == 0) goto LAB_0013006e;
  }
  else if ((bVar18 & bVar25 & (byte)psVar12 & bVar23 & 1) != 0) goto LAB_0013006e;
  if (((ulong)psVar12 & 1) == 0) {
    uVar20 = ZEXT18((byte)((byte)uVar20 | ~bVar23));
  }
  if ((uVar20 & 1) == 0) {
    paVar14 = &local_50.field_2;
    local_50._M_dataplus._M_p = (pointer)paVar14;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"Cannot specify attach.at without attach.to","");
    GrcErrorList::AddError(&g_errorList,0x1024,&(this->super_GdlRuleItem).super_GdlObject,&local_50)
    ;
    _Var19._M_p = local_50._M_dataplus._M_p;
  }
  else {
    paVar14 = &local_70.field_2;
    local_70._M_dataplus._M_p = (pointer)paVar14;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,"Incomplete attachment specification","");
    GrcErrorList::AddWarning
              (&g_errorList,0x11a3,&(this->super_GdlRuleItem).super_GdlObject,&local_70);
    _Var19._M_p = local_70._M_dataplus._M_p;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var19._M_p != paVar14) {
    operator_delete(_Var19._M_p,paVar14->_M_allocated_capacity + 1);
  }
LAB_0013006e:
  uVar26 = (uint)((ulong)((long)(this->m_vpavs).
                                super__Vector_base<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->m_vpavs).
                               super__Vector_base<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 3);
  if (0 < (int)uVar26) {
    uVar13 = (ulong)(uVar26 & 0x7fffffff);
    lVar17 = uVar13 + 1;
    lVar27 = uVar13 * 8;
    lVar29 = uVar13 * -8;
    local_258 = this;
    do {
      pGVar3 = (this->m_vpavs).
               super__Vector_base<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_>._M_impl.
               super__Vector_impl_data._M_start[lVar17 + -2]->m_psymName;
      bVar8 = GrcSymbolTableEntry::IsAttachAtField(pGVar3);
      cVar16 = local_25b[2];
      if ((bVar8) &&
         ((this->m_vpavs).
          super__Vector_base<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_>._M_impl.
          super__Vector_impl_data._M_start[lVar17 + -2]->m_fFlattened == true)) {
        if (local_25b[2] == '\0') {
          local_1c0 = local_1b0;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c0,"x","");
          sVar5 = (pGVar3->m_staFieldName)._M_string_length;
          if (sVar5 == local_1b8) {
            bVar8 = true;
            if (sVar5 == 0) {
              bVar7 = false;
            }
            else {
              iVar9 = bcmp((pGVar3->m_staFieldName)._M_dataplus._M_p,local_1c0,sVar5);
              if (iVar9 != 0) goto LAB_0013016f;
              bVar7 = false;
LAB_00130503:
              bVar8 = true;
            }
          }
          else {
LAB_0013016f:
            local_138 = local_128;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"y","");
            sVar5 = (pGVar3->m_staFieldName)._M_string_length;
            if (sVar5 != local_130) {
              bVar7 = true;
              goto LAB_00130297;
            }
            bVar7 = true;
            if (sVar5 == 0) goto LAB_00130503;
            iVar9 = bcmp((pGVar3->m_staFieldName)._M_dataplus._M_p,local_138,sVar5);
            bVar8 = iVar9 == 0;
          }
        }
        else {
          bVar7 = false;
LAB_00130297:
          bVar8 = false;
        }
        if ((bVar7) && (local_138 != local_128)) {
          operator_delete(local_138,local_128[0] + 1);
        }
        this = local_258;
        if ((cVar16 == '\0') && (local_1c0 != local_1b0)) {
          operator_delete(local_1c0,local_1b0[0] + 1);
        }
        cVar16 = local_25b[1];
        if (!bVar8) {
          if (local_25b[1] == '\0') {
            local_90 = local_80;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"gpoint","");
            sVar5 = (pGVar3->m_staFieldName)._M_string_length;
            if (sVar5 != local_88) goto LAB_00130366;
            if (sVar5 == 0) {
              bVar8 = true;
            }
            else {
              iVar9 = bcmp((pGVar3->m_staFieldName)._M_dataplus._M_p,local_90,sVar5);
              bVar8 = iVar9 == 0;
            }
          }
          else {
LAB_00130366:
            bVar8 = false;
          }
          plVar11 = local_80;
          plVar21 = local_90;
LAB_00130460:
          if (cVar16 == '\0' && plVar21 != plVar11) {
            operator_delete(plVar21,*plVar11 + 1);
          }
          this = local_258;
          if (!bVar8) goto LAB_001304dc;
        }
LAB_00130482:
        pGVar2 = (this->m_vpavs).
                 super__Vector_base<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_>._M_impl
                 .super__Vector_impl_data._M_start[lVar17 + -2];
        if (pGVar2 != (GdlAttrValueSpec *)0x0) {
          GdlAttrValueSpec::~GdlAttrValueSpec(pGVar2);
          operator_delete(pGVar2,0x48);
        }
        ppGVar10 = (this->m_vpavs).
                   super__Vector_base<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        ppGVar6 = (this->m_vpavs).
                  super__Vector_base<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        if ((pointer)((long)ppGVar10 + lVar27) != ppGVar6) {
          memmove(ppGVar10 + lVar17 + -2,ppGVar10 + lVar17 + -1,
                  (long)ppGVar6 + (lVar29 - (long)ppGVar10));
        }
        pppGVar1 = &(this->m_vpavs).
                    super__Vector_base<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
        *pppGVar1 = *pppGVar1 + -1;
      }
      else {
        bVar8 = GrcSymbolTableEntry::IsAttachWithField(pGVar3);
        cVar16 = local_25b[0];
        if ((bVar8) &&
           ((this->m_vpavs).
            super__Vector_base<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_>._M_impl.
            super__Vector_impl_data._M_start[lVar17 + -2]->m_fFlattened == true)) {
          if (local_25b[0] == '\0') {
            local_1e0 = local_1d0;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e0,"x","");
            sVar5 = (pGVar3->m_staFieldName)._M_string_length;
            if (sVar5 == local_1d8) {
              bVar8 = true;
              if (sVar5 == 0) {
                bVar7 = false;
              }
              else {
                iVar9 = bcmp((pGVar3->m_staFieldName)._M_dataplus._M_p,local_1e0,sVar5);
                if (iVar9 != 0) goto LAB_00130231;
                bVar7 = false;
LAB_00130513:
                bVar8 = true;
              }
            }
            else {
LAB_00130231:
              local_158 = local_148;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"y","");
              sVar5 = (pGVar3->m_staFieldName)._M_string_length;
              if (sVar5 != local_150) {
                bVar7 = true;
                goto LAB_0013037f;
              }
              bVar7 = true;
              if (sVar5 == 0) goto LAB_00130513;
              iVar9 = bcmp((pGVar3->m_staFieldName)._M_dataplus._M_p,local_158,sVar5);
              bVar8 = iVar9 == 0;
            }
          }
          else {
            bVar7 = false;
LAB_0013037f:
            bVar8 = false;
          }
          if ((bVar7) && (local_158 != local_148)) {
            operator_delete(local_158,local_148[0] + 1);
          }
          this = local_258;
          if ((cVar16 == '\0') && (local_1e0 != local_1d0)) {
            operator_delete(local_1e0,local_1d0[0] + 1);
          }
          cVar16 = local_25c;
          if (bVar8) goto LAB_00130482;
          if (local_25c == '\0') {
            local_b0 = local_a0;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"gpoint","");
            sVar5 = (pGVar3->m_staFieldName)._M_string_length;
            if (sVar5 != local_a8) goto LAB_0013044e;
            if (sVar5 == 0) {
              bVar8 = true;
            }
            else {
              iVar9 = bcmp((pGVar3->m_staFieldName)._M_dataplus._M_p,local_b0,sVar5);
              bVar8 = iVar9 == 0;
            }
          }
          else {
LAB_0013044e:
            bVar8 = false;
          }
          plVar11 = local_a0;
          plVar21 = local_b0;
          goto LAB_00130460;
        }
      }
LAB_001304dc:
      lVar17 = lVar17 + -1;
      lVar29 = lVar29 + 8;
      lVar27 = lVar27 + -8;
    } while (1 < lVar17);
  }
  return;
}

Assistant:

void GdlSetAttrItem::FixGlyphAttrsInRules(GrcManager * pcman,
	std::vector<GdlGlyphClassDefn *> & vpglfcInClasses, GdlRule * prule, int irit)
{
	//	method on superclass: process constraints.
	GdlRuleItem::FixGlyphAttrsInRules(pcman, vpglfcInClasses, prule, irit);

	bool fXYAt = false;			// true if the attach.at statements need to include x/y
	bool fGpointAt = false;		// true if the attach.at statements need to include gpoint
	bool fXYWith = false;		// true if the attach.with statements need to include x/y
	bool fGpointWith = false;	// true if the attach.with statements need to include gpoint
								// ...due to the way the glyph attributes are defined

	bool fAttachTo = false;		// true if an attach.to statement is present
	bool fAttachAtX = false;	// true if an attach.at.x/gpoint statement is present
	bool fAttachAtY = false;	// true if an attach.at.y/gpoint statement is present
	bool fAttachWithX = false;	// true if an attach.with.x/gpoint statement is present
	bool fAttachWithY = false;	// true if an attach.with.y/gpoint statement is present

	bool fDidAttachAt = false;	// did checks for flattened attach.at
	bool fDidAttachWith = false; // did checks for flattened attach.with

	Symbol psymOutput = OutputClassSymbol();

	//	Process attribute-setting statements.
	int ipavs;
	for (ipavs = 0; ipavs < signed(m_vpavs.size()); ipavs++)
	{
		GdlAttrValueSpec * pavs = m_vpavs[ipavs];

		//	Check that appropriate glyph attributes exist for the slot attributes that
		//	are making use of them.
		Symbol psym = pavs->m_psymName;
		Assert(psym->FitsSymbolType(ksymtSlotAttr) || psym->FitsSymbolType(ksymtFeature));

		if (psym->IsAttachAtField())
		{
			std::string staT = psym->LastField();
			fAttachAtX = fAttachAtX || staT == "x" || staT == "gpoint" || staT == "gpath";
			fAttachAtY = fAttachAtY || staT == "y" || staT == "gpoint" || staT == "gpath";

			if (staT == "gpath")
			{
				g_errorList.AddError(4127, this,
					"Cannot use gpath function within a rule");
				continue;
			}

			//	The engine currently can't handle single-point paths, and within the rule, we
			//	don't have a meaningful and consistent way to change such gpoint statements to
			//	x/y coordinates. So disallow gpoint statements in rules. If we find a way
			//	to make the engine handle single-point paths, take this code out.
			if (staT == "gpoint")
			{
				int nTmp;
				if (pavs->m_pexpValue->ResolveToInteger(&nTmp, false)) // constant, not glyph attr
				{
					g_errorList.AddError(4128, this,
						"Cannot use gpoint function within a rule");
					continue;
				}
			}

			if (fDidAttachAt && pavs->Flattened())
				//	The precompiler flattened the attach.at command into separate fields;
				//	in that case we don't need to check them twice.
				continue;

			//	The value of attach.at must be defined for the class of the slot
			//	receiving the attachment, not this slot.
			int srAttachToValue = AttachToSettingValue();	// 1-based
			if (srAttachToValue == -1)
				g_errorList.AddWarning(4514, this,
					"Attachment checks could not be done for value of attach.at");
			else if (srAttachToValue == -2)
			{
				fAttachTo = true;
				Assert(false);	// a VERY strange thing to happen.
				g_errorList.AddError(4129, this,
					"Inappropriate value of attach.to");
			}
			else
			{
				fAttachTo = true;
				if (pavs->Flattened())
				{
					pavs->CheckAttachAtPoint(pcman, vpglfcInClasses, srAttachToValue-1,
						&fXYAt, &fGpointAt);
					fDidAttachAt = true;
				}
				else
					pavs->FixGlyphAttrsInRules(pcman, vpglfcInClasses, srAttachToValue-1,
						psymOutput);
			}
		}

		else if (psym->IsAttachWithField())
		{
			std::string staT = psym->LastField();
			fAttachWithX = fAttachWithX || staT == "x" || staT == "gpoint" || staT == "gpath";
			fAttachWithY = fAttachWithY || staT == "y" || staT == "gpoint" || staT == "gpath";

			if (staT == "gpath")
			{
				g_errorList.AddError(4130, this,
					"Cannot use gpath function within a rule");
				continue;
			}

			if (fDidAttachWith && pavs->Flattened())
				//	The precompiler flattened the attach.with command into separate fields;
				//	in that case we don't need to check them twice.
				continue;

			if (!fAttachTo)
				fAttachTo = (AttachToSettingValue() != -1);

			if (pavs->Flattened())
			{
				pavs->CheckAttachWithPoint(pcman, vpglfcInClasses, irit,
					&fXYWith, &fGpointWith);
				fDidAttachWith = true;
			}
			else
				pavs->FixGlyphAttrsInRules(pcman, vpglfcInClasses, irit, psymOutput);
		}

		else if (psym->IsComponentRef())
		{
			CheckCompBox(pcman, psym);
		}

		else if (psymOutput == NULL)
		{	// error condition
		}
		else
		{
			if (psym->IsAttachTo())
			{
				GdlSlotRefExpression * pexpSR =
					dynamic_cast<GdlSlotRefExpression *>(pavs->m_pexpValue);
				if (pexpSR)
				{
					auto srAttachTo = static_cast<unsigned int>(pexpSR->SlotNumber());
					if (srAttachTo == 0)
					{
						// no attachment
					}
					else if (prule->NumberOfSlots() <= srAttachTo - 1)
					{
						//	slot out of range--error will be produced later
					}
					// Go ahead and allow this:
//					else if (!dynamic_cast<GdlSetAttrItem *>(prule->Item(srAttachTo - 1)))
//						g_errorList.AddError(4131, this,
//							"Cannot attach to an item in the context");
				}
			}
			pavs->FixGlyphAttrsInRules(pcman, vpglfcInClasses, irit, psymOutput);
		}
	}

	if ((fAttachTo || fAttachAtX || fAttachAtY || fAttachWithX || fAttachWithY) &&
		(!fAttachTo || !fAttachAtX || !fAttachAtY || !fAttachWithX || !fAttachWithY))
	{
		if ((fAttachAtX || fAttachAtY) && !fAttachTo)
			g_errorList.AddError(4132, this,
				"Cannot specify attach.at without attach.to");
		else
			g_errorList.AddWarning(4515, this,
				"Incomplete attachment specification");
	}

	//	Delete any superfluous attach commands (that were added in FlattenPointSlotAttrs
	//	but not needed); ie, either the x/y point fields or the gpath field. It's possible
	//	that we need to keep both versions, if one set of glyphs uses one and another set
	//	uses the other.
	for (ipavs = signed(m_vpavs.size()); --ipavs >= 0; )
	{
		bool fDeleteThis = false;
		Symbol psym = m_vpavs[ipavs]->m_psymName;
		if (psym->IsAttachAtField() && m_vpavs[ipavs]->Flattened())
		{
			if (!fXYAt && (psym->LastFieldIs("x") || psym->LastFieldIs("y")))
				//	Keep attach.at.gpoint; throw away x/y.
				fDeleteThis = true;
			else if (!fGpointAt && psym->LastFieldIs("gpoint"))
				//	Keep attach.at.x/y; throw away gpoint.
				fDeleteThis = true;
		}
		else if (psym->IsAttachWithField() && m_vpavs[ipavs]->Flattened())
		{
			if (!fXYWith && (psym->LastFieldIs("x") || psym->LastFieldIs("y")))
				//	Keep attach.with.gpoint; throw away x/y.
				fDeleteThis = true;
			else if (!fGpointWith && psym->LastFieldIs("gpoint"))
				//	Keep attach.with.x/y; throw away gpoint;
				fDeleteThis = true;
		}

		if (fDeleteThis)
		{
			delete m_vpavs[ipavs];
			m_vpavs.erase(m_vpavs.begin() + ipavs);
		}
	}
}